

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenBlock(BinaryenModuleRef module,char *name,BinaryenExpressionRef *children,
             BinaryenIndex numChildren,BinaryenType type)

{
  Block *this;
  Block *pBVar1;
  Block *pBVar2;
  Type local_58;
  uint local_4c;
  undefined1 local_48 [4];
  BinaryenIndex i;
  Block *local_38;
  Block *ret;
  BinaryenType type_local;
  BinaryenExpressionRef *ppEStack_20;
  BinaryenIndex numChildren_local;
  BinaryenExpressionRef *children_local;
  char *name_local;
  BinaryenModuleRef module_local;
  
  ret = (Block *)type;
  type_local._4_4_ = numChildren;
  ppEStack_20 = children;
  children_local = (BinaryenExpressionRef *)name;
  name_local = (char *)module;
  local_38 = MixedArena::alloc<wasm::Block>(&module->allocator);
  if (children_local != (BinaryenExpressionRef *)0x0) {
    wasm::Name::Name((Name *)local_48,(char *)children_local);
    wasm::Name::operator=(&local_38->name,(Name *)local_48);
  }
  for (local_4c = 0; pBVar1 = ret, local_4c < type_local._4_4_; local_4c = local_4c + 1) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(local_38->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               ppEStack_20[local_4c]);
  }
  pBVar2 = (Block *)BinaryenTypeAuto();
  this = local_38;
  if (pBVar1 == pBVar2) {
    wasm::Block::finalize(local_38);
  }
  else {
    wasm::Type::Type(&local_58,(TypeID)ret);
    wasm::Block::finalize(this,local_58);
  }
  return (BinaryenExpressionRef)local_38;
}

Assistant:

BinaryenExpressionRef BinaryenBlock(BinaryenModuleRef module,
                                    const char* name,
                                    BinaryenExpressionRef* children,
                                    BinaryenIndex numChildren,
                                    BinaryenType type) {
  auto* ret = ((Module*)module)->allocator.alloc<Block>();
  if (name) {
    ret->name = name;
  }
  for (BinaryenIndex i = 0; i < numChildren; i++) {
    ret->list.push_back((Expression*)children[i]);
  }
  if (type != BinaryenTypeAuto()) {
    ret->finalize(Type(type));
  } else {
    ret->finalize();
  }
  return static_cast<Expression*>(ret);
}